

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O0

BrailleCanvas * __thiscall
plot::BrailleCanvas::path<plot::GenericPoint<long>const*>
          (BrailleCanvas *this,Color *color,GenericPoint<long> *first,GenericPoint<long> *last,
          TerminalOp op)

{
  long lVar1;
  long lVar2;
  Point from;
  Point *pPVar3;
  BrailleCanvas *pBVar4;
  GenericPoint<long> end_;
  GenericPoint<long> start;
  TerminalOp op_local;
  GenericPoint<long> *last_local;
  GenericPoint<long> *first_local;
  Color *color_local;
  BrailleCanvas *this_local;
  
  push(this);
  end_.y = first->x;
  start.x = first->y;
  last_local = first;
  while (pPVar3 = last_local + 1, pPVar3 != last) {
    lVar1 = pPVar3->x;
    lVar2 = last_local[1].y;
    from.y = start.x;
    from.x = end_.y;
    line(this,color,from,*pPVar3,Over);
    end_.y = lVar1;
    start.x = lVar2;
    last_local = pPVar3;
  }
  pBVar4 = pop(this,op);
  return pBVar4;
}

Assistant:

BrailleCanvas& path(Color const& color, Iterator first, Iterator last, TerminalOp op = TerminalOp::Over) {
        push();
        auto start = *first;
        while (++first != last) {
            auto end_ = *first;
            line(color, start, end_, TerminalOp::Over);
            start = end_;
        }
        return pop(op);
    }